

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_bx32(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  TCGContext_conflict12 *tcg_ctx;
  int reg;
  uint uVar2;
  int imm;
  DisasJumpType DVar3;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  uintptr_t o_1;
  DisasCompare_conflict2 c;
  
  tcg_ctx = s->uc->tcg_ctx;
  imm = 0;
  reg = get_field1(s,FLD_O_r1,FLD_C_b1);
  uVar2 = get_field1(s,FLD_O_r3,FLD_C_i3);
  uVar1 = (s->fields).presentO;
  if ((uVar1 >> 0x12 & 1) != 0) {
    imm = get_field1(s,FLD_O_i2,FLD_C_b2);
  }
  c._0_1_ = s->insn->data == 0 | 10;
  c.is_64 = false;
  c.g1 = false;
  c.g2 = false;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_add_i64(tcg_ctx,ret,tcg_ctx->regs[reg],tcg_ctx->regs[(int)uVar2]);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  c.u.s32.a = ret_00;
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  c.u.s32.b = ret_01;
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,ret_00,ret);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,ret_01,tcg_ctx->regs[(int)(uVar2 | 1)]);
  store_reg32_i64(tcg_ctx,reg,ret);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  DVar3 = help_branch(s,&c,(_Bool)((byte)(uVar1 >> 0x12) & 1),imm,o->in2);
  return DVar3;
}

Assistant:

static DisasJumpType op_bx32(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    bool is_imm = have_field(s, i2);
    int imm = is_imm ? get_field(s, i2) : 0;
    DisasCompare c;
    TCGv_i64 t;

    c.cond = (s->insn->data ? TCG_COND_LE : TCG_COND_GT);
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_add_i64(tcg_ctx, t, tcg_ctx->regs[r1], tcg_ctx->regs[r3]);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.b, tcg_ctx->regs[r3 | 1]);
    store_reg32_i64(tcg_ctx, r1, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, is_imm, imm, o->in2);
}